

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_fadd_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_1c1;
  string local_1c0;
  opcode local_1a0;
  allocator<char> local_159;
  string local_158;
  opcode local_138;
  allocator<char> local_f1;
  string local_f0;
  opcode local_d0;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"FADD",&local_79);
  make_opcode(&local_58,&local_78,4,0xd8,m32,none);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"FADD",&local_f1);
  make_opcode(&local_d0,&local_f0,4,0xdc,m64,none);
  opcode_table::add_opcode(in_RDI,&local_d0);
  opcode::~opcode(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"FADD",&local_159);
  make_opcode(&local_138,&local_158,0,0xd8,0xc0,st0,sti);
  opcode_table::add_opcode(in_RDI,&local_138);
  opcode::~opcode(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"FADD",&local_1c1);
  make_opcode(&local_1a0,&local_1c0,0,0xdc,0xc0,sti,st0);
  opcode_table::add_opcode(in_RDI,&local_1a0);
  opcode::~opcode(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  return in_RDI;
}

Assistant:

opcode_table make_fadd_table()
    {
    opcode_table t;
    t.add_opcode(make_opcode("FADD", opcode::digit0, 0xD8, opcode::m32, opcode::none));
    t.add_opcode(make_opcode("FADD", opcode::digit0, 0xDC, opcode::m64, opcode::none));
    t.add_opcode(make_opcode("FADD", 0, 0xD8, 0xC0, opcode::st0, opcode::sti));
    t.add_opcode(make_opcode("FADD", 0, 0xDC, 0xC0, opcode::sti, opcode::st0));
    //t.add_opcode(make_opcode("FADD", 0, 0xDE, 0xC1, opcode::none, opcode::none));
    return t;
    }